

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O3

int xmlSaveSwitchEncoding(xmlSaveCtxtPtr ctxt,char *encoding)

{
  xmlCharEncodingHandlerPtr pxVar1;
  xmlBufPtr pxVar2;
  char *msg;
  int iVar3;
  
  iVar3 = 0;
  if (((encoding != (char *)0x0) && (iVar3 = 0, ctxt->encoding == (xmlChar *)0x0)) &&
     (ctxt->buf == (xmlOutputBufferPtr)0x0)) {
    pxVar1 = xmlFindCharEncodingHandler(encoding);
    ctxt->encoding = (xmlChar *)pxVar1;
    if (pxVar1 == (xmlCharEncodingHandlerPtr)0x0) {
      msg = "unknown encoding %s\n";
      iVar3 = 0x57b;
    }
    else {
      pxVar2 = xmlBufCreate();
      ctxt->buf = (xmlOutputBufferPtr)pxVar2;
      if (pxVar2 != (xmlBufPtr)0x0) {
        xmlCharEncOutput((xmlOutputBufferPtr)ctxt,1);
        return 0;
      }
      xmlCharEncCloseFunc((xmlCharEncodingHandler *)ctxt->encoding);
      encoding = "creating encoding buffer";
      iVar3 = 2;
      msg = (char *)0x0;
    }
    __xmlSimpleError(7,iVar3,(xmlNodePtr)0x0,msg,encoding);
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

static int xmlSaveSwitchEncoding(xmlSaveCtxtPtr ctxt, const char *encoding) {
    xmlOutputBufferPtr buf = ctxt->buf;

    if ((encoding != NULL) && (buf->encoder == NULL) && (buf->conv == NULL)) {
	buf->encoder = xmlFindCharEncodingHandler((const char *)encoding);
	if (buf->encoder == NULL) {
	    xmlSaveErr(XML_SAVE_UNKNOWN_ENCODING, NULL,
		       (const char *)encoding);
	    return(-1);
	}
	buf->conv = xmlBufCreate();
	if (buf->conv == NULL) {
	    xmlCharEncCloseFunc(buf->encoder);
	    xmlSaveErrMemory("creating encoding buffer");
	    return(-1);
	}
	/*
	 * initialize the state, e.g. if outputting a BOM
	 */
        xmlCharEncOutput(buf, 1);
    }
    return(0);
}